

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_actor.hpp
# Opt level: O0

void __thiscall
cpp_properties::
properties_actor<cpp_properties::properties_actor_traits<std::set<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_less_key,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
::~properties_actor(properties_actor<cpp_properties::properties_actor_traits<std::set<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_less_key,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
                    *this)

{
  set<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_less_key,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *properties;
  bool bVar1;
  pointer_type key;
  pointer_type ppVar2;
  properties_actor<cpp_properties::properties_actor_traits<std::set<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_less_key,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
  *this_local;
  
  bVar1 = boost::
          optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator!(&this->property);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    properties = this->properties;
    key = boost::
          optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->(&this->property);
    ppVar2 = boost::
             optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&this->property);
    emplace_policy::
    emplace<std::set<std::tuple<std::__cxx11::string,std::__cxx11::string>,less_key,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,std::__cxx11::string>
              (properties,&key->first,&ppVar2->second);
  }
  boost::
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~optional(&this->property);
  return;
}

Assistant:

~properties_actor() {
    if (property) {
      emplacer_policy::emplace(properties, std::move(property->first), std::move(property->second));
    }
  }